

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

POwnedObjectsListNode __thiscall
CorUnix::CThreadSynchronizationInfo::RemoveFirstObjectFromOwnedList
          (CThreadSynchronizationInfo *this)

{
  _LIST_ENTRY *p_Var1;
  _LIST_ENTRY *p_Var2;
  PLIST_ENTRY pLink;
  
  pLink = (this->m_leOwnedObjsList).Flink;
  if (pLink != &this->m_leOwnedObjsList) {
    p_Var1 = pLink->Flink;
    p_Var2 = pLink->Blink;
    p_Var2->Flink = p_Var1;
    p_Var1->Blink = p_Var2;
    return (POwnedObjectsListNode)pLink;
  }
  return (POwnedObjectsListNode)0x0;
}

Assistant:

POwnedObjectsListNode CThreadSynchronizationInfo::RemoveFirstObjectFromOwnedList()
    {
        OwnedObjectsListNode * poolnItem;

        if (IsListEmpty(&m_leOwnedObjsList))
        {
            poolnItem = NULL;
        }
        else
        {
            PLIST_ENTRY pLink = RemoveHeadList(&m_leOwnedObjsList);
            poolnItem = CONTAINING_RECORD(pLink,
                                          OwnedObjectsListNode,
                                          Link);
        }

        return poolnItem;
    }